

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O3

void pnga_access_idx(Integer g_a,Integer *lo,Integer *hi,AccessIndex *index,Integer *ld)

{
  C_Integer *pCVar1;
  long *plVar2;
  int iVar3;
  int iVar4;
  logical lVar5;
  size_t sVar6;
  long lVar7;
  Integer IVar8;
  SingleComplex **ppSVar9;
  C_Integer CVar10;
  ulong uVar11;
  global_array_t *pgVar12;
  long lVar13;
  ushort uVar14;
  DoubleComplex *pDVar15;
  global_array_t *pgVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  Integer ow;
  Integer _hi [7];
  Integer _lo [7];
  char err_string [256];
  long local_208;
  long local_200;
  long local_1f8;
  long local_1f0;
  long *local_1e8;
  Integer local_1e0;
  long local_1d8;
  long local_1d0;
  Integer *local_1c8;
  long *local_1c0;
  long local_1b8 [7];
  long alStack_180 [9];
  int local_138 [3];
  undefined1 uStack_129;
  undefined7 uStack_128;
  
  local_1f8 = g_a * 0x368;
  iVar3 = GA[g_a + 1000].p_handle;
  local_1e0 = g_a;
  lVar5 = pnga_locate(g_a,lo,&local_208);
  if (lVar5 == 0) {
    pnga_error("locate top failed",0);
  }
  if (iVar3 != -1) {
    local_208 = (long)PGRP_LIST[iVar3].inv_map_proc_list[local_208];
  }
  local_1d0 = (long)iVar3;
  iVar3 = armci_domain_id(0,(int)local_208);
  iVar4 = armci_domain_my_id(0);
  if ((iVar3 != iVar4) && (local_208 != CONCAT44(GAme._4_4_,(uint)GAme))) {
    pnga_error("cannot access top of the patch",local_208);
  }
  lVar5 = pnga_locate(local_1e0,hi,&local_208);
  lVar21 = local_1d0;
  if (lVar5 == 0) {
    pnga_error("locate bottom failed",0);
  }
  if ((int)lVar21 != -1) {
    local_208 = (long)PGRP_LIST[lVar21].inv_map_proc_list[local_208];
  }
  lVar21 = local_1e0 + 1000;
  local_1e8 = index;
  iVar3 = armci_domain_id(0,(int)local_208);
  iVar4 = armci_domain_my_id(0);
  if ((iVar3 != iVar4) && (local_208 != CONCAT44(GAme._4_4_,(uint)GAme))) {
    pnga_error("cannot access bottom of the patch",local_208);
  }
  lVar18 = lVar21 * 0x368;
  uVar14 = GA[lVar21].ndim;
  lVar20 = (long)(short)uVar14;
  pgVar16 = GA;
  local_200 = lVar18;
  local_1f0 = lVar21;
  if (lVar20 < 1) {
    pgVar12 = GA + lVar21;
  }
  else {
    lVar21 = 0;
    local_1c8 = lo;
    local_1c0 = ld;
    do {
      if (hi[lVar21] < lo[lVar21]) {
        local_138._0_8_ = 0x6c20746f6e6e6163;
        stack0xfffffffffffffed0 = 0x7220657461636f;
        uStack_129 = 0x65;
        uStack_128 = 0x203a6e6f6967;
        local_1d8 = lVar21;
        strcpy((char *)((long)&uStack_128 + 6),pgVar16->name + lVar18);
        sVar6 = strlen((char *)local_138);
        sprintf((char *)((long)local_138 + (long)(int)sVar6)," [%ld:%ld ",*lo,*hi);
        sVar6 = strlen((char *)local_138);
        lVar18 = local_200;
        iVar3 = (int)sVar6;
        if (1 < *(short *)((long)GA->dims + local_200 + -0x30)) {
          lVar21 = 1;
          do {
            sprintf((char *)((long)local_138 + (long)(int)sVar6),",%ld:%ld ",local_1c8[lVar21],
                    hi[lVar21]);
            sVar6 = strlen((char *)local_138);
            iVar3 = (int)sVar6;
            lVar21 = lVar21 + 1;
          } while (lVar21 < *(short *)((long)GA->dims + lVar18 + -0x30));
        }
        *(undefined2 *)((long)local_138 + (long)iVar3) = 0x5d;
        pnga_error((char *)local_138,local_1e0);
        lVar21 = local_1d8;
        pgVar16 = GA;
        lo = local_1c8;
      }
      lVar21 = lVar21 + 1;
      uVar14 = *(ushort *)((long)pgVar16->dims + lVar18 + -0x30);
      lVar20 = (long)(short)uVar14;
    } while (lVar21 < lVar20);
    pgVar12 = (global_array_t *)((long)pgVar16->dims + lVar18 + -0x30);
    ld = local_1c0;
  }
  if ((int)local_1d0 != -1) {
    local_208 = (long)PGRP_LIST[local_1d0].map_proc_list[local_208];
  }
  iVar3 = pgVar12->distr_type;
  if (iVar3 - 1U < 3) {
    lVar21 = (long)(int)local_208 % pgVar12->num_blocks[0];
    local_138[0] = (int)lVar21;
    if (1 < (short)uVar14) {
      lVar18 = *(long *)((long)pgVar16->num_blocks + local_200);
      lVar19 = 0;
      lVar7 = local_208;
      do {
        lVar7 = (long)((int)lVar7 - (int)lVar21) / lVar18;
        lVar18 = *(long *)((long)pgVar16[1000].num_blocks + lVar19 * 8 + local_1f8 + 8);
        lVar21 = (long)(int)lVar7 % lVar18;
        local_138[lVar19 + 1] = (int)lVar21;
        lVar19 = lVar19 + 1;
      } while ((ulong)(uint)(int)(short)uVar14 - 1 != lVar19);
    }
    lVar18 = local_200;
    if (0 < (short)uVar14) {
      lVar21 = 0;
      do {
        iVar3 = *(int *)((long)local_138 + lVar21);
        lVar18 = *(long *)((long)pgVar16[1000].block_dims + lVar21 * 2 + local_1f8);
        *(long *)((long)alStack_180 + lVar21 * 2 + 8U) = lVar18 * iVar3 + 1;
        lVar18 = ((long)iVar3 + 1) * lVar18;
        *(long *)((long)local_1b8 + lVar21 * 2) = lVar18;
        lVar7 = *(long *)((long)pgVar16[1000].dims + lVar21 * 2 + local_1f8);
        if (lVar7 <= lVar18) {
          lVar18 = lVar7;
        }
        *(long *)((long)local_1b8 + lVar21 * 2) = lVar18;
        lVar21 = lVar21 + 4;
        lVar18 = local_200;
      } while ((ulong)(uint)(int)(short)uVar14 << 2 != lVar21);
    }
  }
  else if (iVar3 == 4) {
    lVar21 = (long)(int)local_208 % pgVar12->num_blocks[0];
    local_138[0] = (int)lVar21;
    if (1 < (short)uVar14) {
      lVar18 = *(long *)((long)pgVar16->num_blocks + local_200);
      lVar19 = 0;
      lVar7 = local_208;
      do {
        lVar7 = (long)((int)lVar7 - (int)lVar21) / lVar18;
        lVar18 = *(long *)((long)pgVar16[1000].num_blocks + lVar19 * 8 + local_1f8 + 8);
        lVar21 = (long)(int)lVar7 % lVar18;
        local_138[lVar19 + 1] = (int)lVar21;
        lVar19 = lVar19 + 1;
      } while ((ulong)(uint)(int)(short)uVar14 - 1 != lVar19);
    }
    lVar18 = local_200;
    if (0 < (short)uVar14) {
      lVar21 = *(long *)(pgVar16->name + local_200 + -8);
      lVar7 = 0;
      iVar3 = 0;
      do {
        iVar4 = *(int *)((long)local_138 + lVar7);
        lVar18 = (long)iVar3 + (long)iVar4;
        *(undefined8 *)((long)alStack_180 + lVar7 * 2 + 8U) = *(undefined8 *)(lVar21 + lVar18 * 8);
        if ((long)iVar4 < *(long *)((long)pgVar12->num_blocks + lVar7 * 2) + -1) {
          lVar18 = pgVar12->mapc[lVar18 + 1] + -1;
        }
        else {
          lVar18 = *(long *)((long)pgVar12->dims + lVar7 * 2);
        }
        *(long *)((long)local_1b8 + lVar7 * 2) = lVar18;
        iVar3 = iVar3 + *(int *)((long)pgVar16[1000].num_blocks + lVar7 * 2 + local_1f8);
        lVar7 = lVar7 + 4;
        lVar18 = local_200;
      } while ((ulong)(uint)(int)(short)uVar14 << 2 != lVar7);
    }
  }
  else if (iVar3 == 0) {
    if (pgVar12->num_rstrctd == 0) {
      if (0 < lVar20) {
        lVar21 = 1;
        lVar7 = 0;
        do {
          lVar21 = lVar21 * *(int *)((long)pgVar16[1000].nblock + lVar7 * 4 + local_1f8);
          lVar7 = lVar7 + 1;
        } while (lVar20 != lVar7);
        if (local_208 < 0 || lVar21 <= local_208) {
LAB_0016d453:
          if (0 < lVar20) {
            sVar6 = lVar20 * 8;
            goto LAB_0016d475;
          }
        }
        else if (0 < lVar20) {
          pCVar1 = pgVar12->mapc;
          lVar7 = 0;
          lVar19 = 0;
          lVar21 = local_208;
          do {
            lVar13 = (long)pgVar12->nblock[lVar19];
            lVar18 = lVar21 % lVar13;
            alStack_180[lVar19 + 1] = pCVar1[lVar18 + lVar7];
            if (lVar18 == lVar13 + -1) {
              CVar10 = pgVar12->dims[lVar19];
            }
            else {
              CVar10 = pCVar1[lVar18 + lVar7 + 1] + -1;
            }
            lVar7 = lVar7 + lVar13;
            local_1b8[lVar19] = CVar10;
            lVar19 = lVar19 + 1;
            lVar21 = lVar21 / lVar13;
            lVar18 = local_200;
          } while (lVar20 != lVar19);
        }
      }
    }
    else if (local_208 < pgVar12->num_rstrctd) {
      if (0 < lVar20) {
        lVar21 = 1;
        lVar7 = 0;
        do {
          lVar21 = lVar21 * *(int *)((long)pgVar16[1000].nblock + lVar7 * 4 + local_1f8);
          lVar7 = lVar7 + 1;
        } while (lVar20 != lVar7);
        if ((local_208 < 0) || (lVar21 <= local_208)) goto LAB_0016d453;
        if (0 < lVar20) {
          pCVar1 = pgVar12->mapc;
          lVar7 = 0;
          lVar19 = 0;
          lVar21 = local_208;
          do {
            lVar13 = (long)pgVar12->nblock[lVar19];
            lVar18 = lVar21 % lVar13;
            alStack_180[lVar19 + 1] = pCVar1[lVar18 + lVar7];
            if (lVar18 == lVar13 + -1) {
              CVar10 = pgVar12->dims[lVar19];
            }
            else {
              CVar10 = pCVar1[lVar18 + lVar7 + 1] + -1;
            }
            lVar7 = lVar7 + lVar13;
            local_1b8[lVar19] = CVar10;
            lVar19 = lVar19 + 1;
            lVar21 = lVar21 / lVar13;
            lVar18 = local_200;
          } while (lVar20 != lVar19);
        }
      }
    }
    else if (0 < (short)uVar14) {
      sVar6 = (ulong)uVar14 << 3;
LAB_0016d475:
      memset(alStack_180 + 1,0,sVar6);
      memset(local_1b8,0xff,sVar6);
      lVar18 = local_200;
    }
  }
  if (*(short *)((long)pgVar16->dims + lVar18 + -0x30) < 1) {
    lVar18 = (long)pgVar16->dims + lVar18 + -0x30;
    lVar21 = lVar20;
  }
  else {
    lVar21 = 0;
    local_1d8 = lVar20;
    do {
      if (local_1b8[lVar21] < lo[lVar21] || lo[lVar21] < alStack_180[lVar21 + 1]) {
        sprintf((char *)local_138,"check subscript failed:%ld not in (%ld:%ld) dim=%d");
        pnga_error((char *)local_138,lVar21);
        pgVar16 = GA;
        lVar18 = local_200;
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 < *(short *)((long)pgVar16->dims + lVar18 + -0x30));
    lVar18 = (long)pgVar16->dims + lVar18 + -0x30;
    lVar21 = local_1d8;
  }
  if (lVar20 == 1) {
    *ld = (local_1b8[0] - alStack_180[1]) + *(long *)(lVar18 + 0xc0) * 2 + 1;
LAB_0016d2b3:
    lVar7 = 1;
    lVar19 = 0;
  }
  else {
    if (lVar21 < 2) goto LAB_0016d2b3;
    lVar7 = 1;
    lVar19 = 0;
    lVar13 = 0;
    do {
      lVar17 = *(long *)((long)pgVar16[1000].width + lVar13 * 8 + local_1f8);
      lVar19 = lVar19 + ((lVar17 + lo[lVar13]) - alStack_180[lVar13 + 1]) * lVar7;
      lVar17 = ((lVar17 * 2 + 1) - alStack_180[lVar13 + 1]) + local_1b8[lVar13];
      ld[lVar13] = lVar17;
      lVar7 = lVar7 * lVar17;
      lVar13 = lVar13 + 1;
    } while (lVar20 + -1 != lVar13);
  }
  if (*(int *)(lVar18 + 0x210) == 0) {
    lVar20 = (long)PGRP_LIST->inv_map_proc_list[local_208];
  }
  else {
    lVar20 = local_208;
    if (*(long *)(lVar18 + 0x2a8) != 0) {
      lVar20 = *(long *)(*(long *)(lVar18 + 0x2a0) + local_208 * 8);
    }
  }
  uVar11 = (ulong)*(int *)(lVar18 + 0x18);
  uVar22 = (((lo[lVar21 + -1] - alStack_180[lVar21]) + *(long *)(lVar18 + 0xb8 + lVar21 * 8)) *
            lVar7 + lVar19) * uVar11 + *(long *)(*(long *)(lVar18 + 0x1e0) + lVar20 * 8);
  IVar8 = pnga_type_c2f((long)*(int *)(lVar18 + 4));
  plVar2 = local_1e8;
  lVar21 = local_1f0;
  switch(IVar8) {
  case 0x3f2:
    ppSVar9 = (SingleComplex **)&INT_MB;
    break;
  default:
    pDVar15 = (DoubleComplex *)0x0;
    goto LAB_0016d3b3;
  case 0x3f4:
    lVar18 = (long)(uVar22 - (long)FLT_MB) >> 2;
    pDVar15 = (DoubleComplex *)FLT_MB;
    goto LAB_0016d3ab;
  case 0x3f5:
    ppSVar9 = (SingleComplex **)&DBL_MB;
    break;
  case 0x3f6:
    ppSVar9 = &SCPL_MB;
    break;
  case 0x3f7:
    lVar18 = (long)(uVar22 - (long)DCPL_MB) >> 4;
    pDVar15 = DCPL_MB;
    goto LAB_0016d3ab;
  }
  pDVar15 = (DoubleComplex *)*ppSVar9;
  lVar18 = (long)(uVar22 - (long)pDVar15) >> 3;
LAB_0016d3ab:
  *local_1e8 = lVar18;
LAB_0016d3b3:
  if (uVar22 % uVar11 != (ulong)pDVar15 % uVar11) {
    printf("%d: lptr=%lu(%lu) lref=%lu(%lu)\n",(ulong)(uint)GAme,uVar22,uVar22 % uVar11,pDVar15,
           (ulong)pDVar15 % uVar11);
    pnga_error("nga_access: MA addressing problem: base address misallignment",lVar21);
  }
  *plVar2 = *plVar2 + 1;
  return;
}

Assistant:

void pnga_access_idx(Integer g_a, Integer lo[], Integer hi[],
                     AccessIndex* index, Integer ld[])
{
char     *ptr;
Integer  handle = GA_OFFSET + g_a;
Integer  ow,i,p_handle;
unsigned long    elemsize;
unsigned long    lref=0, lptr;

   
   p_handle = GA[handle].p_handle;
   if(!pnga_locate(g_a,lo,&ow))pnga_error("locate top failed",0);
   if (p_handle != -1)
      ow = PGRP_LIST[p_handle].inv_map_proc_list[ow];
   if ((armci_domain_id(ARMCI_DOMAIN_SMP, ow) != armci_domain_my_id(ARMCI_DOMAIN_SMP)) && (ow != GAme)) 
      pnga_error("cannot access top of the patch",ow);
   if(!pnga_locate(g_a,hi, &ow))pnga_error("locate bottom failed",0);
   if (p_handle != -1)
      ow = PGRP_LIST[p_handle].inv_map_proc_list[ow];
   if ((armci_domain_id(ARMCI_DOMAIN_SMP, ow) != armci_domain_my_id(ARMCI_DOMAIN_SMP)) && (ow != GAme)) 
      pnga_error("cannot access bottom of the patch",ow);

   for (i=0; i<GA[handle].ndim; i++)
       if(lo[i]>hi[i]) {
           ga_RegionError(GA[handle].ndim, lo, hi, g_a);
       }

   
   if (p_handle != -1)
      ow = PGRP_LIST[p_handle].map_proc_list[ow];

   gam_Location(ow,handle, lo, &ptr, ld);

   /*
    * return patch address as the distance elements from the reference address
    *
    * .in Fortran we need only the index to the type array: dbl_mb or int_mb
    *  that are elements of COMMON in the the mafdecls.h include file
    * .in C we need both the index and the pointer
    */

   elemsize = (unsigned long)GA[handle].elemsize;

   /* compute index and check if it is correct */
   switch (pnga_type_c2f(GA[handle].type)){
     case MT_F_DBL:
        *index = (AccessIndex) ((DoublePrecision*)ptr - DBL_MB);
        lref = (unsigned long)DBL_MB;
        break;

     case MT_F_DCPL:
        *index = (AccessIndex) ((DoubleComplex*)ptr - DCPL_MB);
        lref = (unsigned long)DCPL_MB;
        break;

     case MT_F_SCPL:
        *index = (AccessIndex) ((SingleComplex*)ptr - SCPL_MB);
        lref = (unsigned long)SCPL_MB;
        break;

     case MT_F_INT:
        *index = (AccessIndex) ((Integer*)ptr - INT_MB);
        lref = (unsigned long)INT_MB;
        break;

     case MT_F_REAL:
        *index = (AccessIndex) ((float*)ptr - FLT_MB);
        lref = (unsigned long)FLT_MB;
        break;        
   }

   /* check the allignment */
   lptr = (unsigned long)ptr;
   if( lptr%elemsize != lref%elemsize ){ 
       printf("%d: lptr=%lu(%lu) lref=%lu(%lu)\n",(int)GAme,lptr,lptr%elemsize,
                                                    lref,lref%elemsize);
       pnga_error("nga_access: MA addressing problem: base address misallignment",
                 handle);
   }

   /* adjust index for Fortran addressing */
   (*index) ++ ;
   FLUSH_CACHE;

}